

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

void __thiscall test_result_wrapper::fail_if(test_result_wrapper *this,bool condition,char *text)

{
  size_t sVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,condition) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
    if (text == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x154620);
    }
    else {
      sVar1 = strlen(text);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,text,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    this->pass = false;
  }
  return;
}

Assistant:

void fail_if(bool condition, const char *text){
        if (condition){
            cerr << "ERROR: " << text << "\n";
            pass = false;
        }
    }